

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_keyexpimp.c
# Opt level: O3

int gost_kdftree2012_256
              (uchar *keyout,size_t keyout_len,uchar *key,size_t keylen,uchar *label,
              size_t label_len,uchar *seed,size_t seed_len,size_t representation)

{
  uchar *puVar1;
  int iVar2;
  HMAC_CTX *ctx;
  uchar *puVar3;
  char *name;
  EVP_MD *md;
  int reason;
  uint uVar4;
  uint uVar5;
  size_t len;
  uchar *data;
  bool bVar6;
  uchar zero;
  uchar local_61;
  undefined4 local_60;
  uint local_5c;
  uchar *local_58;
  uchar *local_50;
  size_t local_48;
  uchar *local_40;
  size_t local_38;
  
  local_61 = '\0';
  uVar5 = (int)keyout_len * 8;
  local_60 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
             (int)keyout_len << 0x1b;
  local_50 = label;
  local_48 = label_len;
  local_40 = key;
  local_38 = keylen;
  ctx = (HMAC_CTX *)HMAC_CTX_new();
  if (ctx == (HMAC_CTX *)0x0) {
    reason = 0xc0100;
    iVar2 = 0xd9;
  }
  else {
    if (keyout_len != 0 && (keyout_len & 0x1f) == 0) {
      if ((char)(uVar5 >> 0x18) == '\0') {
        len = 4;
        puVar3 = (uchar *)&local_60;
        do {
          data = puVar3 + 1;
          len = len - 1;
          puVar1 = puVar3 + 1;
          puVar3 = data;
        } while (*puVar1 == '\0');
      }
      else {
        len = 4;
        data = (uchar *)&local_60;
      }
      uVar5 = (uint)(keyout_len >> 5);
      if (0 < (int)uVar5) {
        local_58 = (uchar *)((long)&local_58 - representation);
        uVar4 = 1;
        do {
          local_5c = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18
          ;
          name = OBJ_nid2sn(0x3d6);
          md = EVP_get_digestbyname(name);
          iVar2 = HMAC_Init_ex(ctx,local_40,(int)local_38,md,(ENGINE *)0x0);
          if ((((iVar2 < 1) || (iVar2 = HMAC_Update(ctx,local_58,representation), iVar2 < 1)) ||
              (iVar2 = HMAC_Update(ctx,local_50,local_48), iVar2 < 1)) ||
             (((iVar2 = HMAC_Update(ctx,&local_61,1), iVar2 < 1 ||
               (iVar2 = HMAC_Update(ctx,seed,seed_len), iVar2 < 1)) ||
              ((iVar2 = HMAC_Update(ctx,data,len), iVar2 < 1 ||
               (iVar2 = HMAC_Final(ctx,keyout,(uint *)0x0), iVar2 < 1)))))) {
            ERR_GOST_error(0x95,0xc0103,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_keyexpimp.c"
                           ,0xf7);
            HMAC_CTX_free(ctx);
            return 0;
          }
          HMAC_CTX_reset(ctx);
          keyout = keyout + 0x20;
          bVar6 = uVar4 != uVar5;
          uVar4 = uVar4 + 1;
        } while (bVar6);
      }
      HMAC_CTX_free(ctx);
      return 1;
    }
    reason = 0xc0103;
    iVar2 = 0xde;
  }
  ERR_GOST_error(0x95,reason,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_keyexpimp.c"
                 ,iVar2);
  return 0;
}

Assistant:

int gost_kdftree2012_256(unsigned char *keyout, size_t keyout_len,
                         const unsigned char *key, size_t keylen,
                         const unsigned char *label, size_t label_len,
                         const unsigned char *seed, size_t seed_len,
                         const size_t representation)
{
    int iters, i = 0;
    unsigned char zero = 0;
    unsigned char *ptr = keyout;
    HMAC_CTX *ctx;
    unsigned char *len_ptr = NULL;
    uint32_t len_repr = be32(keyout_len * 8);
    size_t len_repr_len = 4;

    ctx = HMAC_CTX_new();
    if (ctx == NULL) {
        GOSTerr(GOST_F_GOST_KDFTREE2012_256, ERR_R_MALLOC_FAILURE);
        return 0;
    }

    if ((keyout_len == 0) || (keyout_len % 32 != 0)) {
        GOSTerr(GOST_F_GOST_KDFTREE2012_256, ERR_R_INTERNAL_ERROR);
        return 0;
    }
    iters = keyout_len / 32;

    len_ptr = (unsigned char *)&len_repr;
    while (*len_ptr == 0) {
        len_ptr++;
        len_repr_len--;
    }

    for (i = 1; i <= iters; i++) {
        uint32_t iter_net = be32(i);
        unsigned char *rep_ptr =
            ((unsigned char *)&iter_net) + (4 - representation);

        if (HMAC_Init_ex(ctx, key, keylen,
                         EVP_get_digestbynid(NID_id_GostR3411_2012_256),
                         NULL) <= 0
            || HMAC_Update(ctx, rep_ptr, representation) <= 0
            || HMAC_Update(ctx, label, label_len) <= 0
            || HMAC_Update(ctx, &zero, 1) <= 0
            || HMAC_Update(ctx, seed, seed_len) <= 0
            || HMAC_Update(ctx, len_ptr, len_repr_len) <= 0
            || HMAC_Final(ctx, ptr, NULL) <= 0) {
            GOSTerr(GOST_F_GOST_KDFTREE2012_256, ERR_R_INTERNAL_ERROR);
            HMAC_CTX_free(ctx);
            return 0;
        }

        HMAC_CTX_reset(ctx);
        ptr += 32;
    }

    HMAC_CTX_free(ctx);

    return 1;
}